

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O1

int opengv::absolute_pose::modules::gpnp1::init(EVP_PKEY_CTX *ctx)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 (*in_RCX) [16];
  double *in_RDX;
  double *in_RSI;
  undefined1 (*in_R8) [16];
  undefined1 (*in_R9) [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 (*in_stack_00000008) [16];
  
  auVar11 = *in_RCX;
  auVar10 = vsubpd_avx(auVar11,*in_R8);
  dVar1 = *(double *)in_RCX[1];
  dVar8 = dVar1 - *(double *)in_R8[1];
  auVar12 = vsubpd_avx(auVar11,*in_R9);
  dVar9 = dVar1 - *(double *)in_R9[1];
  auVar13 = vsubpd_avx(auVar11,*in_stack_00000008);
  dVar1 = dVar1 - *(double *)in_stack_00000008[1];
  dVar2 = *in_RDX;
  dVar3 = in_RDX[1];
  dVar4 = in_RDX[3];
  auVar90._8_8_ = 0;
  auVar90._0_8_ = dVar4;
  dVar5 = in_RDX[4];
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar2 * -2.0;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = dVar3 * -2.0 * dVar5;
  auVar11 = vfmadd231sd_fma(auVar105,auVar90,auVar73);
  dVar6 = in_RDX[2];
  dVar7 = in_RDX[5];
  auVar112._8_8_ = 0;
  auVar112._0_8_ = dVar7;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = dVar6 * -2.0;
  auVar11 = vfmadd213sd_fma(auVar115,auVar112,auVar11);
  *(double *)ctx =
       dVar7 * dVar7 +
       dVar6 * dVar6 + dVar5 * dVar5 + dVar3 * dVar3 + dVar4 * dVar4 + auVar11._0_8_ + dVar2 * dVar2
  ;
  dVar2 = *in_RSI;
  dVar3 = in_RSI[1];
  auVar91._8_8_ = 0;
  auVar91._0_8_ = in_RDX[3];
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *in_RDX;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = in_RDX[1];
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar2 * -2.0 * in_RDX[3];
  auVar74._8_8_ = 0;
  auVar74._0_8_ = dVar2 + dVar2;
  auVar11 = vfmadd231sd_fma(auVar44,auVar99,auVar74);
  dVar2 = in_RSI[3];
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar2;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *in_RDX * -2.0;
  auVar11 = vfmadd213sd_fma(auVar100,auVar75,auVar11);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar2 + dVar2;
  auVar11 = vfmadd213sd_fma(auVar45,auVar91,auVar11);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = dVar3 + dVar3;
  auVar11 = vfmadd213sd_fma(auVar76,auVar106,auVar11);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = in_RDX[4];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar3 * -2.0;
  auVar11 = vfmadd213sd_fma(auVar59,auVar46,auVar11);
  dVar2 = in_RSI[4];
  auVar77._8_8_ = 0;
  auVar77._0_8_ = dVar2;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = in_RDX[1] * -2.0;
  auVar11 = vfmadd213sd_fma(auVar92,auVar77,auVar11);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar2 + dVar2;
  auVar11 = vfmadd213sd_fma(auVar60,auVar46,auVar11);
  dVar2 = in_RSI[2];
  auVar93._8_8_ = 0;
  auVar93._0_8_ = in_RDX[2];
  auVar78._8_8_ = 0;
  auVar78._0_8_ = dVar2 + dVar2;
  auVar11 = vfmadd213sd_fma(auVar78,auVar93,auVar11);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = in_RDX[5];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar2 * -2.0;
  auVar11 = vfmadd213sd_fma(auVar47,auVar61,auVar11);
  dVar2 = in_RSI[5];
  auVar79._8_8_ = 0;
  auVar79._0_8_ = dVar2;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = in_RDX[2] * -2.0;
  auVar11 = vfmadd213sd_fma(auVar94,auVar79,auVar11);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar2 + dVar2;
  auVar11 = vfmadd213sd_fma(auVar48,auVar61,auVar11);
  *(long *)(ctx + 0x28) = auVar11._0_8_;
  dVar2 = *in_RSI;
  dVar3 = in_RSI[1];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar8 * dVar8 + auVar10._0_8_ * auVar10._0_8_ + auVar10._8_8_ * auVar10._8_8_;
  auVar11 = vsqrtsd_avx(auVar28,auVar28);
  dVar4 = in_RSI[3];
  auVar80._8_8_ = 0;
  auVar80._0_8_ = dVar4;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar2 * dVar2 - auVar11._0_8_ * auVar11._0_8_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar2 * -2.0;
  auVar11 = vfmadd213sd_fma(auVar49,auVar80,auVar29);
  dVar2 = in_RSI[4];
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar2;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar3 * dVar3 + dVar4 * dVar4 + auVar11._0_8_;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = dVar3 * -2.0;
  auVar11 = vfmadd213sd_fma(auVar62,auVar50,auVar30);
  dVar3 = in_RSI[2];
  dVar4 = in_RSI[5];
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar4;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar3 * dVar3 + dVar2 * dVar2 + auVar11._0_8_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar3 * -2.0;
  auVar11 = vfmadd213sd_fma(auVar51,auVar63,auVar31);
  *(double *)(ctx + 0x50) = dVar4 * dVar4 + auVar11._0_8_;
  dVar2 = *in_RDX;
  dVar3 = in_RDX[1];
  dVar4 = in_RDX[6];
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar4;
  dVar5 = in_RDX[7];
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar2 * -2.0;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = dVar3 * -2.0 * dVar5;
  auVar11 = vfmadd231sd_fma(auVar101,auVar81,auVar64);
  dVar6 = in_RDX[2];
  dVar7 = in_RDX[8];
  auVar107._8_8_ = 0;
  auVar107._0_8_ = dVar7;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = dVar6 * -2.0;
  auVar11 = vfmadd213sd_fma(auVar113,auVar107,auVar11);
  *(double *)(ctx + 8) =
       dVar7 * dVar7 +
       dVar5 * dVar5 + dVar4 * dVar4 + dVar6 * dVar6 + dVar3 * dVar3 + auVar11._0_8_ + dVar2 * dVar2
  ;
  dVar2 = *in_RSI;
  dVar3 = in_RSI[1];
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *in_RDX;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = dVar2 + dVar2;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = in_RDX[1] * (dVar3 + dVar3);
  auVar11 = vfmadd231sd_fma(auVar82,auVar95,auVar65);
  dVar4 = in_RSI[2];
  auVar114._8_8_ = 0;
  auVar114._0_8_ = in_RDX[2];
  auVar108._8_8_ = 0;
  auVar108._0_8_ = dVar4 + dVar4;
  auVar11 = vfmadd213sd_fma(auVar108,auVar114,auVar11);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = in_RDX[6];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar2 * -2.0;
  auVar11 = vfmadd213sd_fma(auVar32,auVar83,auVar11);
  dVar2 = in_RSI[6];
  auVar109._8_8_ = 0;
  auVar109._0_8_ = dVar2;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *in_RDX * -2.0;
  auVar11 = vfmadd213sd_fma(auVar96,auVar109,auVar11);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar2 + dVar2;
  auVar11 = vfmadd213sd_fma(auVar33,auVar83,auVar11);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = in_RDX[7];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar3 * -2.0;
  auVar11 = vfmadd213sd_fma(auVar52,auVar84,auVar11);
  dVar2 = in_RSI[7];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar2;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = in_RDX[1] * -2.0;
  auVar11 = vfmadd213sd_fma(auVar97,auVar34,auVar11);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar2 + dVar2;
  auVar11 = vfmadd213sd_fma(auVar35,auVar84,auVar11);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = in_RDX[8];
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar4 * -2.0;
  auVar11 = vfmadd213sd_fma(auVar66,auVar53,auVar11);
  dVar2 = in_RSI[8];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar2;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = in_RDX[2] * -2.0;
  auVar11 = vfmadd213sd_fma(auVar85,auVar36,auVar11);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar2 + dVar2;
  auVar11 = vfmadd213sd_fma(auVar37,auVar53,auVar11);
  *(long *)(ctx + 0x30) = auVar11._0_8_;
  dVar2 = *in_RSI;
  dVar3 = in_RSI[1];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar9 * dVar9 + auVar12._0_8_ * auVar12._0_8_ + auVar12._8_8_ * auVar12._8_8_;
  auVar11 = vsqrtsd_avx(auVar15,auVar15);
  dVar4 = in_RSI[2];
  dVar5 = in_RSI[6];
  auVar86._8_8_ = 0;
  auVar86._0_8_ = dVar5;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = (dVar2 * dVar2 - auVar11._0_8_ * auVar11._0_8_) + dVar3 * dVar3 + dVar4 * dVar4;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar2 * -2.0;
  auVar11 = vfmadd213sd_fma(auVar38,auVar86,auVar16);
  dVar2 = in_RSI[7];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar2;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar5 * dVar5 + auVar11._0_8_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar3 * -2.0;
  auVar11 = vfmadd213sd_fma(auVar54,auVar39,auVar17);
  dVar3 = in_RSI[8];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar3;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar2 * dVar2 + auVar11._0_8_;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar4 * -2.0;
  auVar11 = vfmadd213sd_fma(auVar55,auVar40,auVar18);
  *(double *)(ctx + 0x58) = dVar3 * dVar3 + auVar11._0_8_;
  dVar2 = *in_RDX;
  dVar3 = in_RDX[1];
  dVar4 = in_RDX[9];
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar4;
  dVar5 = in_RDX[10];
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar2 * -2.0;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = dVar3 * -2.0 * dVar5;
  auVar11 = vfmadd231sd_fma(auVar98,auVar67,auVar56);
  dVar6 = in_RDX[2];
  dVar7 = in_RDX[0xb];
  auVar102._8_8_ = 0;
  auVar102._0_8_ = dVar7;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = dVar6 * -2.0;
  auVar11 = vfmadd213sd_fma(auVar110,auVar102,auVar11);
  *(double *)(ctx + 0x10) =
       dVar7 * dVar7 +
       dVar5 * dVar5 + dVar4 * dVar4 + dVar6 * dVar6 + dVar3 * dVar3 + auVar11._0_8_ + dVar2 * dVar2
  ;
  dVar2 = *in_RSI;
  dVar3 = in_RSI[1];
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *in_RDX;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar2 + dVar2;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = (dVar3 + dVar3) * in_RDX[1];
  auVar11 = vfmadd231sd_fma(auVar68,auVar87,auVar57);
  dVar4 = in_RSI[2];
  auVar111._8_8_ = 0;
  auVar111._0_8_ = in_RDX[2];
  auVar103._8_8_ = 0;
  auVar103._0_8_ = dVar4 + dVar4;
  auVar11 = vfmadd213sd_fma(auVar103,auVar111,auVar11);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = in_RDX[9];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar2 * -2.0;
  auVar11 = vfmadd213sd_fma(auVar19,auVar69,auVar11);
  dVar2 = in_RSI[9];
  auVar104._8_8_ = 0;
  auVar104._0_8_ = dVar2;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *in_RDX * -2.0;
  auVar11 = vfmadd213sd_fma(auVar88,auVar104,auVar11);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar2 + dVar2;
  auVar11 = vfmadd213sd_fma(auVar20,auVar69,auVar11);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = in_RDX[10];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar3 * -2.0;
  auVar11 = vfmadd213sd_fma(auVar41,auVar70,auVar11);
  dVar2 = in_RSI[10];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar2;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = in_RDX[1] * -2.0;
  auVar11 = vfmadd213sd_fma(auVar89,auVar21,auVar11);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar2 + dVar2;
  auVar11 = vfmadd213sd_fma(auVar22,auVar70,auVar11);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = in_RDX[0xb];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar4 * -2.0;
  auVar11 = vfmadd213sd_fma(auVar58,auVar42,auVar11);
  dVar2 = in_RSI[0xb];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar2;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = in_RDX[2] * -2.0;
  auVar11 = vfmadd213sd_fma(auVar71,auVar23,auVar11);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar2 + dVar2;
  auVar11 = vfmadd213sd_fma(auVar24,auVar42,auVar11);
  *(long *)(ctx + 0x38) = auVar11._0_8_;
  dVar2 = *in_RSI;
  dVar3 = in_RSI[1];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar1 * dVar1 + auVar13._0_8_ * auVar13._0_8_ + auVar13._8_8_ * auVar13._8_8_;
  auVar11 = vsqrtsd_avx(auVar11,auVar11);
  dVar1 = in_RSI[2];
  dVar4 = in_RSI[9];
  auVar72._8_8_ = 0;
  auVar72._0_8_ = dVar4;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = (dVar2 * dVar2 - auVar11._0_8_ * auVar11._0_8_) + dVar3 * dVar3 + dVar1 * dVar1;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar2 * -2.0;
  auVar11 = vfmadd213sd_fma(auVar25,auVar72,auVar12);
  dVar2 = in_RSI[10];
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar2;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar4 * dVar4 + auVar11._0_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar3 * -2.0;
  auVar11 = vfmadd213sd_fma(auVar43,auVar26,auVar13);
  dVar3 = in_RSI[0xb];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar3;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar1 * -2.0;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar2 * dVar2 + auVar11._0_8_;
  auVar11 = vfmadd213sd_fma(auVar10,auVar27,auVar14);
  *(double *)(ctx + 0x60) = dVar3 * dVar3 + auVar11._0_8_;
  return (int)in_stack_00000008;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp1::init(
    Eigen::Matrix<double,5,3> & groebnerMatrix,
    const Eigen::Matrix<double,12,1> & a,
    Eigen::Matrix<double,12,1> & n,
    Eigen::Vector3d & c0,
    Eigen::Vector3d & c1,
    Eigen::Vector3d & c2,
    Eigen::Vector3d & c3 )
{
  Eigen::Vector3d temp = c0-c1;
  double c01w = temp.norm()*temp.norm();
  temp = c0-c2;
  double c02w = temp.norm()*temp.norm();
  temp = c0-c3;
  double c03w = temp.norm()*temp.norm();

  groebnerMatrix(0,0) = -2*n(0,0)*n(3,0)-2*n(1,0)*n(4,0)-2*n(2,0)*n(5,0)+pow(n(0,0),2)+pow(n(3,0),2)+pow(n(1,0),2)+pow(n(4,0),2)+pow(n(2,0),2)+pow(n(5,0),2);
  groebnerMatrix(0,1) = 2*a(0,0)*n(0,0)-2*a(0,0)*n(3,0)-2*n(0,0)*a(3,0)+2*a(3,0)*n(3,0)+2*a(1,0)*n(1,0)-2*a(1,0)*n(4,0)-2*n(1,0)*a(4,0)+2*a(4,0)*n(4,0)+2*a(2,0)*n(2,0)-2*a(2,0)*n(5,0)-2*n(2,0)*a(5,0)+2*a(5,0)*n(5,0);
  groebnerMatrix(0,2) = -c01w+pow(a(0,0),2)-2*a(0,0)*a(3,0)+pow(a(3,0),2)+pow(a(1,0),2)-2*a(1,0)*a(4,0)+pow(a(4,0),2)+pow(a(2,0),2)-2*a(2,0)*a(5,0)+pow(a(5,0),2);
  groebnerMatrix(1,0) = -2*n(0,0)*n(6,0)-2*n(1,0)*n(7,0)-2*n(2,0)*n(8,0)+pow(n(0,0),2)+pow(n(1,0),2)+pow(n(2,0),2)+pow(n(6,0),2)+pow(n(7,0),2)+pow(n(8,0),2);
  groebnerMatrix(1,1) = 2*a(0,0)*n(0,0)+2*a(1,0)*n(1,0)+2*a(2,0)*n(2,0)-2*a(0,0)*n(6,0)-2*n(0,0)*a(6,0)+2*a(6,0)*n(6,0)-2*a(1,0)*n(7,0)-2*n(1,0)*a(7,0)+2*a(7,0)*n(7,0)-2*a(2,0)*n(8,0)-2*n(2,0)*a(8,0)+2*a(8,0)*n(8,0);
  groebnerMatrix(1,2) = -c02w+pow(a(0,0),2)+pow(a(1,0),2)+pow(a(2,0),2)-2*a(0,0)*a(6,0)+pow(a(6,0),2)-2*a(1,0)*a(7,0)+pow(a(7,0),2)-2*a(2,0)*a(8,0)+pow(a(8,0),2);
  groebnerMatrix(2,0) = -2*n(0,0)*n(9,0)-2*n(1,0)*n(10,0)-2*n(2,0)*n(11,0)+pow(n(0,0),2)+pow(n(1,0),2)+pow(n(2,0),2)+pow(n(9,0),2)+pow(n(10,0),2)+pow(n(11,0),2);
  groebnerMatrix(2,1) = 2*a(0,0)*n(0,0)+2*a(1,0)*n(1,0)+2*a(2,0)*n(2,0)-2*a(0,0)*n(9,0)-2*n(0,0)*a(9,0)+2*a(9,0)*n(9,0)-2*a(1,0)*n(10,0)-2*n(1,0)*a(10,0)+2*a(10,0)*n(10,0)-2*a(2,0)*n(11,0)-2*n(2,0)*a(11,0)+2*a(11,0)*n(11,0);
  groebnerMatrix(2,2) = -c03w+pow(a(0,0),2)+pow(a(1,0),2)+pow(a(2,0),2)-2*a(0,0)*a(9,0)+pow(a(9,0),2)-2*a(1,0)*a(10,0)+pow(a(10,0),2)-2*a(2,0)*a(11,0)+pow(a(11,0),2);
}